

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O1

bool wallet::CreateFromDump
               (ArgsManager *args,string *name,path *wallet_path,bilingual_str *error,
               vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bilingual_str *fmt;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  string original;
  undefined1 *puVar4;
  undefined1 *puVar5;
  DatabaseBatch *pDVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  char cVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  DBErrors DVar11;
  CWallet *this_00;
  uchar *puVar12;
  string *psVar13;
  uint32_t *args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_01;
  _Head_base<0UL,_wallet::WalletDatabase_*,_false> database_00;
  bilingual_str *args_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  undefined8 uVar15;
  long in_FS_OFFSET;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  vector<unsigned_char,_std::allocator<unsigned_char>_> k;
  unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_> batch;
  shared_ptr<wallet::CWallet> wallet;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> database;
  DatabaseStatus status;
  uint32_t ver;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  string line;
  string value;
  string key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> parsed_checksum;
  DatabaseOptions options;
  string format_hasher_line;
  string file_format;
  string format_value;
  string format_key;
  string magic_hasher_line;
  string version_value;
  string magic_key;
  uint256 checksum;
  HashWriter hasher;
  ifstream dump_file;
  path dump_path;
  string dump_filename;
  undefined8 in_stack_fffffffffffffa08;
  bilingual_str *this_01;
  undefined4 in_stack_fffffffffffffa20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_5d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_5b8;
  DatabaseBatch *local_5a0;
  long *local_598;
  undefined1 local_590 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_588;
  long *local_580;
  DatabaseStatus local_578;
  uint32_t local_574;
  unique_lock<std::recursive_mutex> local_570;
  string local_560;
  long *local_540 [2];
  long local_530 [2];
  undefined1 local_520 [33];
  char cStack_4ff;
  char cStack_4fe;
  char cStack_4fd;
  char cStack_4fc;
  char cStack_4fb;
  char cStack_4fa;
  char cStack_4f9;
  undefined8 uStack_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  bilingual_str local_4e0;
  undefined1 local_4a0 [24];
  undefined1 local_488 [16];
  undefined1 local_478 [24];
  int64_t local_460;
  string local_458;
  undefined1 local_438 [32];
  undefined1 local_418 [32];
  bilingual_str local_3f8;
  bilingual_str local_3b8;
  undefined1 local_378 [32];
  undefined1 local_358 [33];
  char cStack_337;
  char cStack_336;
  char cStack_335;
  char cStack_334;
  char cStack_333;
  char cStack_332;
  char cStack_331;
  char cStack_330;
  char cStack_32f;
  char cStack_32e;
  char cStack_32d;
  char cStack_32c;
  char cStack_32b;
  char cStack_32a;
  char cStack_329;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  undefined1 local_318 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  undefined1 local_2f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  uint64_t local_2b8;
  bilingual_str local_2b0 [8];
  path local_a8;
  string local_80;
  path local_60;
  long local_38;
  
  local_318._8_8_ = local_318._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_2b0[0].original.field_2;
  pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)warnings;
  local_2b0[0].original._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"-dumpfile","");
  local_318._0_8_ = &local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"");
  psVar13 = (string *)local_318;
  ArgsManager::GetArg(&local_80,args,&local_2b0[0].original,psVar13);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._0_8_ != &local_308) {
    operator_delete((void *)local_318._0_8_,local_308._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0[0].original._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b0[0].original._M_dataplus._M_p,
                    local_2b0[0].original.field_2._M_allocated_capacity + 1);
  }
  if (local_80._M_string_length == 0) {
    local_2b0[0].original._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2b0,
               "No dump file provided. To use createfromdump, -dumpfile=<filename> must be provided."
               ,"");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_2b0[0].translated._M_dataplus._M_p = (pointer)&local_2b0[0].translated.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2b0[0].translated,
                 "No dump file provided. To use createfromdump, -dumpfile=<filename> must be provided."
                 ,"");
    }
    else {
      local_318._0_8_ =
           "No dump file provided. To use createfromdump, -dumpfile=<filename> must be provided.";
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_2b0[0].translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                 (char **)local_318);
    }
    CreateFromDump();
    bVar8 = false;
    goto LAB_0014fd24;
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_2b0,&local_80,auto_format);
  std::filesystem::__cxx11::path::path(&local_a8,(path *)local_2b0);
  std::filesystem::__cxx11::path::~path((path *)local_2b0);
  std::filesystem::absolute(&local_60);
  CreateFromDump();
  std::filesystem::__cxx11::path::clear((path *)local_2b0);
  std::filesystem::__cxx11::path::~path((path *)local_2b0);
  cVar7 = std::filesystem::status((path *)&local_a8);
  if ((cVar7 == -1) || (cVar7 == '\0')) {
    local_318._0_8_ = &local_308;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_318,"Dump file %s does not exist.","");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_2f8._0_8_ = &local_2e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2f8,"Dump file %s does not exist.","");
    }
    else {
      local_4a0[0] = (string)0x8e;
      local_4a0[1] = true;
      local_4a0._2_2_ = 0x49;
      local_4a0._4_4_ = BERKELEY;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
                 (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_4a0);
    }
    puVar5 = local_4a0 + 0x10;
    local_4a0[0] = SUB81(puVar5,0);
    local_4a0[1] = SUB81((ulong)puVar5 >> 8,0);
    local_4a0._2_2_ = (undefined2)((ulong)puVar5 >> 0x10);
    local_4a0._4_4_ = (undefined4)((ulong)puVar5 >> 0x20);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4a0,local_a8._M_pathname._M_dataplus._M_p,
               local_a8._M_pathname._M_dataplus._M_p + local_a8._M_pathname._M_string_length);
    tinyformat::format<std::__cxx11::string>
              (local_2b0,(tinyformat *)local_318,(bilingual_str *)local_4a0,psVar13);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->original,&local_2b0[0].original);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->translated,&local_2b0[0].translated);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0[0].translated._M_dataplus._M_p != &local_2b0[0].translated.field_2) {
      operator_delete(local_2b0[0].translated._M_dataplus._M_p,
                      local_2b0[0].translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0[0].original._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0[0].original._M_dataplus._M_p,
                      local_2b0[0].original.field_2._M_allocated_capacity + 1);
    }
    puVar4 = (undefined1 *)
             CONCAT44(local_4a0._4_4_,CONCAT22(local_4a0._2_2_,CONCAT11(local_4a0[1],local_4a0[0])))
    ;
    if (puVar4 != puVar5) {
      operator_delete(puVar4,local_4a0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != &local_2e8) {
      operator_delete((void *)local_2f8._0_8_,local_2e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._0_8_ != &local_308) {
      operator_delete((void *)local_318._0_8_,local_308._M_allocated_capacity + 1);
    }
    bVar8 = false;
  }
  else {
    std::ifstream::ifstream(local_2b0,local_a8._M_pathname._M_dataplus._M_p,_S_in);
    local_2c8 = (undefined1  [16])0x0;
    local_2d8 = (undefined1  [16])0x0;
    local_2e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 )0x0;
    local_2f8 = (undefined1  [16])0x0;
    local_308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 )0x0;
    local_318 = (undefined1  [16])0x0;
    local_2b8 = 0;
    CSHA256::CSHA256((CSHA256 *)local_318);
    local_328 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 )0x0;
    stack0xfffffffffffffcc8 = (undefined1  [16])0x0;
    local_358._0_8_ = local_358 + 0x10;
    local_358._8_8_ = 0;
    local_358[0x10] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_2b0,(string *)local_358,',');
    local_378._0_8_ = local_378 + 0x10;
    local_378._8_8_ = 0;
    local_378[0x10] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_2b0,(string *)local_378,'\n');
    if ((local_358._8_8_ == DAT_006c3d70) &&
       ((local_358._8_8_ == 0 ||
        (iVar10 = bcmp((void *)local_358._0_8_,DUMP_MAGIC_abi_cxx11_,local_358._8_8_), iVar10 == 0))
       )) {
      str._M_str = (char *)local_378._0_8_;
      str._M_len = local_378._8_8_;
      bVar8 = ParseUInt32(str,&local_574);
      if (!bVar8) {
        local_3b8.original._M_dataplus._M_p = (pointer)&local_3b8.original.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3b8,"Error: Unable to parse version %u as a uint32_t","");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_3b8.translated._M_dataplus._M_p = (pointer)&local_3b8.translated.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3b8.translated,
                     "Error: Unable to parse version %u as a uint32_t","");
        }
        else {
          local_4e0.original._M_dataplus._M_p = "Error: Unable to parse version %u as a uint32_t";
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (&local_3b8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                     (char **)&local_4e0);
        }
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)local_4a0,(tinyformat *)&local_3b8,(bilingual_str *)local_378,
                   psVar13);
LAB_0014fc15:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&error->original,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&error->translated,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_488 + 8));
        if ((undefined1 *)local_488._8_8_ != local_478 + 8) {
          operator_delete((void *)local_488._8_8_,local_478._8_8_ + 1);
        }
        puVar5 = (undefined1 *)
                 CONCAT44(local_4a0._4_4_,
                          CONCAT22(local_4a0._2_2_,CONCAT11(local_4a0[1],local_4a0[0])));
        if (puVar5 != local_4a0 + 0x10) {
          operator_delete(puVar5,local_4a0._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8.translated._M_dataplus._M_p != &local_3b8.translated.field_2) {
          operator_delete(local_3b8.translated._M_dataplus._M_p,
                          local_3b8.translated.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8.original._M_dataplus._M_p != &local_3b8.original.field_2) {
          operator_delete(local_3b8.original._M_dataplus._M_p,
                          local_3b8.original.field_2._M_allocated_capacity + 1);
        }
        std::ifstream::close();
        goto LAB_0014fccd;
      }
      args_00 = &DUMP_VERSION;
      if (local_574 != DUMP_VERSION) {
        local_3b8.original._M_dataplus._M_p = (pointer)&local_3b8.original.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3b8,
                   "Error: Dumpfile version is not supported. This version of bitcoin-wallet only supports version 1 dumpfiles. Got dumpfile with version %s"
                   ,"");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_3b8.translated._M_dataplus._M_p = (pointer)&local_3b8.translated.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3b8.translated,
                     "Error: Dumpfile version is not supported. This version of bitcoin-wallet only supports version 1 dumpfiles. Got dumpfile with version %s"
                     ,"");
        }
        else {
          local_4e0.original._M_dataplus._M_p =
               "Error: Dumpfile version is not supported. This version of bitcoin-wallet only supports version 1 dumpfiles. Got dumpfile with version %s"
          ;
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (&local_3b8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                     (char **)&local_4e0);
        }
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)local_4a0,(tinyformat *)&local_3b8,(bilingual_str *)local_378,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_00);
        goto LAB_0014fc15;
      }
      args_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378;
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                (&local_3f8.translated,(tinyformat *)"%s,%s\n",local_358,args_01,pbVar14);
      CSHA256::Write((CSHA256 *)local_318,(uchar *)local_3f8.translated._M_dataplus._M_p,
                     local_3f8.translated._M_string_length);
      local_3f8.original._M_dataplus._M_p = (pointer)&local_3f8.original.field_2;
      local_3f8.original._M_string_length = 0;
      local_3f8.original.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_2b0,(string *)(local_418 + 0x20),',');
      local_418._0_8_ = local_418 + 0x10;
      local_418._8_8_ = 0;
      local_418[0x10] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_2b0,(string *)local_418,'\n');
      iVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_418 + 0x20),"format");
      if (iVar10 == 0) {
        puVar5 = local_4a0 + 0x10;
        local_4a0[0] = SUB81(puVar5,0);
        local_4a0[1] = SUB81((ulong)puVar5 >> 8,0);
        local_4a0._2_2_ = (undefined2)((ulong)puVar5 >> 0x10);
        local_4a0._4_4_ = (undefined4)((ulong)puVar5 >> 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"-format","");
        psVar13 = (string *)local_418;
        ArgsManager::GetArg((string *)local_438,args,(string *)local_4a0,psVar13);
        puVar4 = (undefined1 *)
                 CONCAT44(local_4a0._4_4_,
                          CONCAT22(local_4a0._2_2_,CONCAT11(local_4a0[1],local_4a0[0])));
        if (puVar4 != puVar5) {
          operator_delete(puVar4,local_4a0._16_8_ + 1);
        }
        if (local_438._8_8_ == 0) {
          _((bilingual_str *)local_4a0,(ConstevalStringLiteral)0x491ef6);
          CreateFromDump();
LAB_0014fdc0:
          bVar8 = false;
        }
        else {
          uVar15 = 0x100000000;
          iVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_438,"bdb");
          if (iVar10 != 0) {
            iVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_438,"sqlite");
            if (iVar10 == 0) {
              uVar15 = 0x100000001;
            }
            else {
              iVar10 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_438,"bdb_swap");
              if (iVar10 != 0) {
                _(&local_3b8,(ConstevalStringLiteral)0x491f59);
                tinyformat::format<std::__cxx11::string>
                          ((bilingual_str *)local_4a0,(tinyformat *)&local_3b8,
                           (bilingual_str *)local_438,psVar13);
                CreateFromDump();
                goto LAB_0014fdc0;
              }
              uVar15 = 0x100000003;
            }
          }
          if ((local_438._8_8_ != local_418._8_8_) ||
             ((local_438._8_8_ != 0 &&
              (iVar10 = bcmp((void *)local_438._0_8_,(void *)local_418._0_8_,local_438._8_8_),
              iVar10 != 0)))) {
            _(&local_3b8,(ConstevalStringLiteral)0x491fac);
            tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                      ((bilingual_str *)local_4a0,(tinyformat *)&local_3b8,
                       (bilingual_str *)local_418,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_438,pbVar14);
            std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                      (warnings,(bilingual_str *)local_4a0);
            bilingual_str::~bilingual_str((bilingual_str *)local_4a0);
            bilingual_str::~bilingual_str(&local_3b8);
          }
          tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                    (&local_458,(tinyformat *)"%s,%s\n",local_418 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418,
                     pbVar14);
          CSHA256::Write((CSHA256 *)local_318,(uchar *)local_458._M_dataplus._M_p,
                         local_458._M_string_length);
          local_4a0[0] = (string)0x0;
          local_4a0[1] = false;
          local_4a0._8_4_ = local_4a0._8_4_ & 0xffffff00;
          local_4a0._16_8_ = 0;
          local_488._0_8_ = local_478;
          local_488._8_8_ = (pointer)0x0;
          local_478[0] = '\0';
          local_478._16_2_ = 1;
          local_478[0x12] = '\0';
          local_460 = 100;
          ReadDatabaseArgs(args,(DatabaseOptions *)local_4a0);
          local_4a0[1] = true;
          local_4a0._4_4_ = (undefined4)uVar15;
          local_4a0._8_4_ = (undefined4)((ulong)uVar15 >> 0x20);
          this_01 = error;
          MakeDatabase((wallet *)&local_580,wallet_path,(DatabaseOptions *)local_4a0,&local_578,
                       error);
          if (local_580 == (long *)0x0) {
            bVar8 = false;
          }
          else {
            this_00 = (CWallet *)operator_new(0x4a8);
            database_00._M_head_impl = (WalletDatabase *)&local_598;
            local_598 = local_580;
            local_580 = (long *)0x0;
            CWallet::CWallet(this_00,(Chain *)0x0,name,
                             (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                              )database_00._M_head_impl);
            local_590 = (undefined1  [8])this_00;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<wallet::CWallet*,void(*)(wallet::CWallet*),std::allocator<void>,void>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_590 + 8),this_00,
                       WalletToolReleaseWallet);
            if (local_598 != (long *)0x0) {
              (**(code **)(*local_598 + 8))();
            }
            local_570._M_device = (mutex_type *)((long)local_590 + 0x1e8);
            local_598 = (long *)0x0;
            local_570._M_owns = false;
            std::unique_lock<std::recursive_mutex>::lock(&local_570);
            DVar11 = CWallet::LoadWallet((CWallet *)local_590);
            if (DVar11 == LOAD_OK) {
              plVar3 = *(long **)((long)local_590 + 0xe0);
              if (plVar3 == (long *)0x0) {
                __assert_fail("static_cast<bool>(m_database)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                              ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const")
                ;
              }
              (**(code **)(*plVar3 + 0x70))(&local_5a0,plVar3,1);
              (*local_5a0->_vptr_DatabaseBatch[0xb])();
              pbVar14 = &this_01->translated;
              bVar8 = true;
              fmt = (bilingual_str *)(local_520 + 0x20);
              do {
                if (*(int *)((long)&local_2b0[0].translated._M_dataplus._M_p +
                            *(long *)(local_2b0[0].original._M_dataplus._M_p + -0x18)) != 0) break;
                uStack_4f8 = 0;
                local_4f0._M_local_buf[0] = '\0';
                unique0x100021ff = (pointer)&local_4f0;
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_2b0,(string *)fmt,',');
                local_520._0_8_ = local_520 + 0x10;
                local_520._8_8_ = 0;
                local_520[0x10] = '\0';
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_2b0,(string *)local_520,'\n');
                iVar10 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)fmt,"checksum");
                if (iVar10 == 0) {
                  hex_str_01._M_str = (char *)local_520._0_8_;
                  hex_str_01._M_len = local_520._8_8_;
                  ParseHex<unsigned_char>
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_4e0,
                             hex_str_01);
                  if (local_4e0.original._M_string_length -
                      (long)local_4e0.original._M_dataplus._M_p == 0x20) {
                    if ((pointer)local_4e0.original._M_string_length !=
                        local_4e0.original._M_dataplus._M_p) {
                      memmove(local_358 + 0x20,local_4e0.original._M_dataplus._M_p,0x20);
                    }
                  }
                  else {
                    local_540[0] = local_530;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_540,"Error: Checksum is not the correct size","");
                    original._M_string_length = (size_type)this_01;
                    original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa08;
                    original.field_2._M_allocated_capacity = (size_type)pbVar14;
                    original.field_2._8_4_ = in_stack_fffffffffffffa20;
                    original.field_2._12_4_ = DVar11;
                    Untranslated(&local_3b8,original);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator=(&this_01->original,&local_3b8.original);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator=(pbVar14,&local_3b8.translated);
                    bilingual_str::~bilingual_str(&local_3b8);
                    if (local_540[0] != local_530) {
                      operator_delete(local_540[0],local_530[0] + 1);
                    }
                    bVar8 = false;
                  }
                  if ((pointer)local_4e0.original._M_dataplus._M_p != (pointer)0x0) {
                    operator_delete(local_4e0.original._M_dataplus._M_p,
                                    local_4e0.original.field_2._M_allocated_capacity -
                                    (long)local_4e0.original._M_dataplus._M_p);
                  }
                  bVar9 = true;
                }
                else {
                  args_02 = (bilingual_str *)local_520;
                  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                            (&local_560,(tinyformat *)"%s,%s\n",(char *)fmt,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_520,&error->original);
                  CSHA256::Write((CSHA256 *)local_318,(uchar *)local_560._M_dataplus._M_p,
                                 local_560._M_string_length);
                  bVar9 = false;
                  if ((uStack_4f8 != 0) && (bVar9 = false, local_520._8_8_ != 0)) {
                    str_00._M_str = stack0xfffffffffffffb00;
                    str_00._M_len = uStack_4f8;
                    bVar9 = IsHex(str_00);
                    if (bVar9) {
                      str_01._M_str = (char *)local_520._0_8_;
                      str_01._M_len = local_520._8_8_;
                      bVar9 = IsHex(str_01);
                      if (bVar9) {
                        hex_str._M_str = stack0xfffffffffffffb00;
                        hex_str._M_len = uStack_4f8;
                        ParseHex<unsigned_char>(&local_5b8,hex_str);
                        hex_str_00._M_str = (char *)local_520._0_8_;
                        hex_str_00._M_len = local_520._8_8_;
                        ParseHex<unsigned_char>(&local_5d0,hex_str_00);
                        local_3b8.original._M_dataplus._M_p =
                             (pointer)local_5b8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                        local_3b8.original._M_string_length =
                             (long)local_5b8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_5b8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                        local_4e0.original._M_dataplus._M_p =
                             (pointer)local_5d0.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                        local_4e0.original._M_string_length =
                             (size_type)
                             (local_5d0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             -(long)local_5d0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                        bVar9 = DatabaseBatch::Write<Span<unsigned_char>,Span<unsigned_char>>
                                          (local_5a0,(Span<unsigned_char> *)&local_3b8,
                                           (Span<unsigned_char> *)&local_4e0,true);
                        if (!bVar9) {
                          _(&local_4e0,(ConstevalStringLiteral)0x492088);
                          tinyformat::format<>(&local_3b8,&local_4e0);
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          operator=(&this_01->original,&local_3b8.original);
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          operator=(pbVar14,&local_3b8.translated);
                          bilingual_str::~bilingual_str(&local_3b8);
                          bilingual_str::~bilingual_str(&local_4e0);
                          bVar8 = false;
                        }
                        if (local_5d0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_5d0.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_5d0.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_5d0.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_5b8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start !=
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0) {
                          operator_delete(local_5b8.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_5b8.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_5b8.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        bVar9 = !bVar9;
                        goto LAB_0014f169;
                      }
                      _(&local_4e0,(ConstevalStringLiteral)0x492062);
                      tinyformat::format<std::__cxx11::string>
                                (&local_3b8,(tinyformat *)&local_4e0,(bilingual_str *)local_520,
                                 &args_02->original);
                    }
                    else {
                      _(&local_4e0,(ConstevalStringLiteral)0x49203e);
                      tinyformat::format<std::__cxx11::string>
                                (&local_3b8,(tinyformat *)&local_4e0,fmt,&args_02->original);
                    }
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator=(&this_01->original,&local_3b8.original);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator=(pbVar14,&local_3b8.translated);
                    bilingual_str::~bilingual_str(&local_3b8);
                    bilingual_str::~bilingual_str(&local_4e0);
                    bVar9 = true;
                    bVar8 = false;
                  }
LAB_0014f169:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_560._M_dataplus._M_p != &local_560.field_2) {
                    operator_delete(local_560._M_dataplus._M_p,
                                    local_560.field_2._M_allocated_capacity + 1);
                  }
                }
                if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
                  operator_delete((void *)local_520._0_8_,
                                  CONCAT71(local_520._17_7_,local_520[0x10]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)stack0xfffffffffffffb00 != &local_4f0) {
                  operator_delete(stack0xfffffffffffffb00,
                                  CONCAT17(local_4f0._M_local_buf[7],
                                           CONCAT16(local_4f0._M_local_buf[6],
                                                    CONCAT15(local_4f0._M_local_buf[5],
                                                             CONCAT14(local_4f0._M_local_buf[4],
                                                                      CONCAT13(local_4f0.
                                                                               _M_local_buf[3],
                                                                               CONCAT12(local_4f0.
                                                                                        _M_local_buf
                                                                                        [2],CONCAT11
                                                  (local_4f0._M_local_buf[1],
                                                   local_4f0._M_local_buf[0]))))))) + 1);
                }
              } while (!bVar9);
              if (bVar8) {
                HashWriter::GetHash((uint256 *)(local_520 + 0x20),(HashWriter *)local_318);
                puVar12 = std::
                          __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                                    (local_358 + 0x20,local_318);
                if (puVar12 == local_318) {
                  _(&local_3b8,(ConstevalStringLiteral)0x4920b4);
                  CreateFromDump();
                }
                else {
                  auVar17[0] = -(local_4f0._M_local_buf[0] == local_328._M_local_buf[0]);
                  auVar17[1] = -(local_4f0._M_local_buf[1] == local_328._M_local_buf[1]);
                  auVar17[2] = -(local_4f0._M_local_buf[2] == local_328._M_local_buf[2]);
                  auVar17[3] = -(local_4f0._M_local_buf[3] == local_328._M_local_buf[3]);
                  auVar17[4] = -(local_4f0._M_local_buf[4] == local_328._M_local_buf[4]);
                  auVar17[5] = -(local_4f0._M_local_buf[5] == local_328._M_local_buf[5]);
                  auVar17[6] = -(local_4f0._M_local_buf[6] == local_328._M_local_buf[6]);
                  auVar17[7] = -(local_4f0._M_local_buf[7] == local_328._M_local_buf[7]);
                  auVar17[8] = -(local_4f0._M_local_buf[8] == local_328._M_local_buf[8]);
                  auVar17[9] = -(local_4f0._M_local_buf[9] == local_328._M_local_buf[9]);
                  auVar17[10] = -(local_4f0._M_local_buf[10] == local_328._M_local_buf[10]);
                  auVar17[0xb] = -(local_4f0._M_local_buf[0xb] == local_328._M_local_buf[0xb]);
                  auVar17[0xc] = -(local_4f0._M_local_buf[0xc] == local_328._M_local_buf[0xc]);
                  auVar17[0xd] = -(local_4f0._M_local_buf[0xd] == local_328._M_local_buf[0xd]);
                  auVar17[0xe] = -(local_4f0._M_local_buf[0xe] == local_328._M_local_buf[0xe]);
                  auVar17[0xf] = -(local_4f0._M_local_buf[0xf] == local_328._M_local_buf[0xf]);
                  auVar16[0] = -(local_520[0x20] == local_358[0x20]);
                  auVar16[1] = -(cStack_4ff == cStack_337);
                  auVar16[2] = -(cStack_4fe == cStack_336);
                  auVar16[3] = -(cStack_4fd == cStack_335);
                  auVar16[4] = -(cStack_4fc == cStack_334);
                  auVar16[5] = -(cStack_4fb == cStack_333);
                  auVar16[6] = -(cStack_4fa == cStack_332);
                  auVar16[7] = -(cStack_4f9 == cStack_331);
                  auVar16[8] = -((char)uStack_4f8 == cStack_330);
                  auVar16[9] = -(uStack_4f8._1_1_ == cStack_32f);
                  auVar16[10] = -(uStack_4f8._2_1_ == cStack_32e);
                  auVar16[0xb] = -(uStack_4f8._3_1_ == cStack_32d);
                  auVar16[0xc] = -(uStack_4f8._4_1_ == cStack_32c);
                  auVar16[0xd] = -(uStack_4f8._5_1_ == cStack_32b);
                  auVar16[0xe] = -(uStack_4f8._6_1_ == cStack_32a);
                  auVar16[0xf] = -(uStack_4f8._7_1_ == cStack_329);
                  auVar16 = auVar16 & auVar17;
                  if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff)
                  goto LAB_0014f584;
                  _(&local_4e0,(ConstevalStringLiteral)0x4920cc);
                  s.m_size = 0x20;
                  s.m_data = local_520 + 0x20;
                  HexStr_abi_cxx11_((string *)local_520,s);
                  s_00.m_size = 0x20;
                  s_00.m_data = local_358 + 0x20;
                  HexStr_abi_cxx11_(&local_560,s_00);
                  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                            (&local_3b8,(tinyformat *)&local_4e0,(bilingual_str *)local_520,
                             &local_560,&error->original);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(&this_01->original,&local_3b8.original);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(pbVar14,&local_3b8.translated);
                  bilingual_str::~bilingual_str(&local_3b8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_560._M_dataplus._M_p != &local_560.field_2) {
                    operator_delete(local_560._M_dataplus._M_p,
                                    local_560.field_2._M_allocated_capacity + 1);
                  }
                  if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
                    operator_delete((void *)local_520._0_8_,
                                    CONCAT71(local_520._17_7_,local_520[0x10]) + 1);
                  }
                  bilingual_str::~bilingual_str(&local_4e0);
                }
                bVar8 = false;
              }
LAB_0014f584:
              (*local_5a0->_vptr_DatabaseBatch[(ulong)((byte)~bVar8 & 1) + 0xc])();
              pDVar6 = local_5a0;
              local_5a0 = (DatabaseBatch *)0x0;
              if (pDVar6 != (DatabaseBatch *)0x0) {
                (*pDVar6->_vptr_DatabaseBatch[5])();
              }
              std::ifstream::close();
              if (local_5a0 != (DatabaseBatch *)0x0) {
                (*local_5a0->_vptr_DatabaseBatch[5])();
              }
            }
            else {
              _(&local_4e0,(ConstevalStringLiteral)0x492004);
              tinyformat::format<std::__cxx11::string>
                        (&local_3b8,(tinyformat *)&local_4e0,(bilingual_str *)name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         database_00._M_head_impl);
              CreateFromDump();
              bVar8 = true;
            }
            std::unique_lock<std::recursive_mutex>::~unique_lock(&local_570);
            if (DVar11 == LOAD_OK) {
              this._M_pi = _Stack_588._M_pi;
              _local_590 = (undefined1  [16])0x0;
              if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
              }
              if (bVar8 == false) {
                std::filesystem::remove_all((path *)wallet_path);
              }
            }
            else {
              bVar8 = false;
            }
            if (_Stack_588._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_588._M_pi);
            }
          }
          if (local_580 != (long *)0x0) {
            (**(code **)(*local_580 + 8))();
          }
          if ((undefined1 *)local_488._0_8_ != local_478) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::
            _M_destroy((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)
                       local_488,CONCAT71(local_478._1_7_,local_478[0]));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) {
            operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
          }
        }
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
      }
      else {
        _(&local_3b8,(ConstevalStringLiteral)0x491ead);
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)local_4a0,(tinyformat *)&local_3b8,
                   (bilingual_str *)(local_418 + 0x20),args_01);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&error->original,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&error->translated,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_488 + 8));
        bilingual_str::~bilingual_str((bilingual_str *)local_4a0);
        bilingual_str::~bilingual_str(&local_3b8);
        std::ifstream::close();
        bVar8 = false;
      }
      if ((undefined1 *)local_418._0_8_ != local_418 + 0x10) {
        operator_delete((void *)local_418._0_8_,CONCAT71(local_418._17_7_,local_418[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8.original._M_dataplus._M_p != &local_3f8.original.field_2) {
        operator_delete(local_3f8.original._M_dataplus._M_p,
                        CONCAT71(local_3f8.original.field_2._M_allocated_capacity._1_7_,
                                 local_3f8.original.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8.translated._M_dataplus._M_p != &local_3f8.translated.field_2) {
        operator_delete(local_3f8.translated._M_dataplus._M_p,
                        local_3f8.translated.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      paVar1 = &local_3b8.original.field_2;
      local_3b8.original._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3b8,
                 "Error: Dumpfile identifier record is incorrect. Got \"%s\", expected \"%s\".","");
      paVar2 = &local_3b8.translated.field_2;
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_3b8.translated._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3b8.translated,
                   "Error: Dumpfile identifier record is incorrect. Got \"%s\", expected \"%s\".",""
                  );
      }
      else {
        local_4e0.original._M_dataplus._M_p =
             "Error: Dumpfile identifier record is incorrect. Got \"%s\", expected \"%s\".";
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_3b8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                   (char **)&local_4e0);
      }
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                ((bilingual_str *)local_4a0,(tinyformat *)&local_3b8,(bilingual_str *)local_358,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &DUMP_MAGIC_abi_cxx11_,pbVar14);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->original,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->translated,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_488 + 8));
      if ((undefined1 *)local_488._8_8_ != local_478 + 8) {
        operator_delete((void *)local_488._8_8_,local_478._8_8_ + 1);
      }
      puVar5 = (undefined1 *)
               CONCAT44(local_4a0._4_4_,
                        CONCAT22(local_4a0._2_2_,CONCAT11(local_4a0[1],local_4a0[0])));
      if (puVar5 != local_4a0 + 0x10) {
        operator_delete(puVar5,local_4a0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8.translated._M_dataplus._M_p != paVar2) {
        operator_delete(local_3b8.translated._M_dataplus._M_p,
                        local_3b8.translated.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8.original._M_dataplus._M_p != paVar1) {
        operator_delete(local_3b8.original._M_dataplus._M_p,
                        local_3b8.original.field_2._M_allocated_capacity + 1);
      }
      std::ifstream::close();
LAB_0014fccd:
      bVar8 = false;
    }
    if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
      operator_delete((void *)local_378._0_8_,CONCAT71(local_378._17_7_,local_378[0x10]) + 1);
    }
    if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
      operator_delete((void *)local_358._0_8_,CONCAT71(local_358._17_7_,local_358[0x10]) + 1);
    }
    std::ifstream::~ifstream(local_2b0);
  }
  std::filesystem::__cxx11::path::~path(&local_a8);
LAB_0014fd24:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool CreateFromDump(const ArgsManager& args, const std::string& name, const fs::path& wallet_path, bilingual_str& error, std::vector<bilingual_str>& warnings)
{
    // Get the dumpfile
    std::string dump_filename = args.GetArg("-dumpfile", "");
    if (dump_filename.empty()) {
        error = _("No dump file provided. To use createfromdump, -dumpfile=<filename> must be provided.");
        return false;
    }

    fs::path dump_path = fs::PathFromString(dump_filename);
    dump_path = fs::absolute(dump_path);
    if (!fs::exists(dump_path)) {
        error = strprintf(_("Dump file %s does not exist."), fs::PathToString(dump_path));
        return false;
    }
    std::ifstream dump_file{dump_path};

    // Compute the checksum
    HashWriter hasher{};
    uint256 checksum;

    // Check the magic and version
    std::string magic_key;
    std::getline(dump_file, magic_key, ',');
    std::string version_value;
    std::getline(dump_file, version_value, '\n');
    if (magic_key != DUMP_MAGIC) {
        error = strprintf(_("Error: Dumpfile identifier record is incorrect. Got \"%s\", expected \"%s\"."), magic_key, DUMP_MAGIC);
        dump_file.close();
        return false;
    }
    // Check the version number (value of first record)
    uint32_t ver;
    if (!ParseUInt32(version_value, &ver)) {
        error =strprintf(_("Error: Unable to parse version %u as a uint32_t"), version_value);
        dump_file.close();
        return false;
    }
    if (ver != DUMP_VERSION) {
        error = strprintf(_("Error: Dumpfile version is not supported. This version of bitcoin-wallet only supports version 1 dumpfiles. Got dumpfile with version %s"), version_value);
        dump_file.close();
        return false;
    }
    std::string magic_hasher_line = strprintf("%s,%s\n", magic_key, version_value);
    hasher << Span{magic_hasher_line};

    // Get the stored file format
    std::string format_key;
    std::getline(dump_file, format_key, ',');
    std::string format_value;
    std::getline(dump_file, format_value, '\n');
    if (format_key != "format") {
        error = strprintf(_("Error: Dumpfile format record is incorrect. Got \"%s\", expected \"format\"."), format_key);
        dump_file.close();
        return false;
    }
    // Get the data file format with format_value as the default
    std::string file_format = args.GetArg("-format", format_value);
    if (file_format.empty()) {
        error = _("No wallet file format provided. To use createfromdump, -format=<format> must be provided.");
        return false;
    }
    DatabaseFormat data_format;
    if (file_format == "bdb") {
        data_format = DatabaseFormat::BERKELEY;
    } else if (file_format == "sqlite") {
        data_format = DatabaseFormat::SQLITE;
    } else if (file_format == "bdb_swap") {
        data_format = DatabaseFormat::BERKELEY_SWAP;
    } else {
        error = strprintf(_("Unknown wallet file format \"%s\" provided. Please provide one of \"bdb\" or \"sqlite\"."), file_format);
        return false;
    }
    if (file_format != format_value) {
        warnings.push_back(strprintf(_("Warning: Dumpfile wallet format \"%s\" does not match command line specified format \"%s\"."), format_value, file_format));
    }
    std::string format_hasher_line = strprintf("%s,%s\n", format_key, format_value);
    hasher << Span{format_hasher_line};

    DatabaseOptions options;
    DatabaseStatus status;
    ReadDatabaseArgs(args, options);
    options.require_create = true;
    options.require_format = data_format;
    std::unique_ptr<WalletDatabase> database = MakeDatabase(wallet_path, options, status, error);
    if (!database) return false;

    // dummy chain interface
    bool ret = true;
    std::shared_ptr<CWallet> wallet(new CWallet(/*chain=*/nullptr, name, std::move(database)), WalletToolReleaseWallet);
    {
        LOCK(wallet->cs_wallet);
        DBErrors load_wallet_ret = wallet->LoadWallet();
        if (load_wallet_ret != DBErrors::LOAD_OK) {
            error = strprintf(_("Error creating %s"), name);
            return false;
        }

        // Get the database handle
        WalletDatabase& db = wallet->GetDatabase();
        std::unique_ptr<DatabaseBatch> batch = db.MakeBatch();
        batch->TxnBegin();

        // Read the records from the dump file and write them to the database
        while (dump_file.good()) {
            std::string key;
            std::getline(dump_file, key, ',');
            std::string value;
            std::getline(dump_file, value, '\n');

            if (key == "checksum") {
                std::vector<unsigned char> parsed_checksum = ParseHex(value);
                if (parsed_checksum.size() != checksum.size()) {
                    error = Untranslated("Error: Checksum is not the correct size");
                    ret = false;
                    break;
                }
                std::copy(parsed_checksum.begin(), parsed_checksum.end(), checksum.begin());
                break;
            }

            std::string line = strprintf("%s,%s\n", key, value);
            hasher << Span{line};

            if (key.empty() || value.empty()) {
                continue;
            }

            if (!IsHex(key)) {
                error = strprintf(_("Error: Got key that was not hex: %s"), key);
                ret = false;
                break;
            }
            if (!IsHex(value)) {
                error = strprintf(_("Error: Got value that was not hex: %s"), value);
                ret = false;
                break;
            }

            std::vector<unsigned char> k = ParseHex(key);
            std::vector<unsigned char> v = ParseHex(value);
            if (!batch->Write(Span{k}, Span{v})) {
                error = strprintf(_("Error: Unable to write record to new wallet"));
                ret = false;
                break;
            }
        }

        if (ret) {
            uint256 comp_checksum = hasher.GetHash();
            if (checksum.IsNull()) {
                error = _("Error: Missing checksum");
                ret = false;
            } else if (checksum != comp_checksum) {
                error = strprintf(_("Error: Dumpfile checksum does not match. Computed %s, expected %s"), HexStr(comp_checksum), HexStr(checksum));
                ret = false;
            }
        }

        if (ret) {
            batch->TxnCommit();
        } else {
            batch->TxnAbort();
        }

        batch.reset();

        dump_file.close();
    }
    wallet.reset(); // The pointer deleter will close the wallet for us.

    // Remove the wallet dir if we have a failure
    if (!ret) {
        fs::remove_all(wallet_path);
    }

    return ret;
}